

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# explode.c
# Opt level: O1

void update_explode(void)

{
  EXPLOSION *pEVar1;
  float fVar2;
  EXPLOSION **ppEVar3;
  EXPLOSION *__ptr;
  
  if (explosions != (EXPLOSION *)0x0) {
    ppEVar3 = &explosions;
    __ptr = explosions;
    do {
      fVar2 = __ptr->time + 1.0 / ((float)__ptr->big * 0.5 + 1.0);
      __ptr->time = fVar2;
      if (fVar2 <= 32.0) {
        ppEVar3 = &__ptr->next;
        __ptr = __ptr->next;
      }
      else {
        *ppEVar3 = __ptr->next;
        pEVar1 = __ptr->next;
        free(__ptr);
        __ptr = pEVar1;
      }
    } while (__ptr != (EXPLOSION *)0x0);
  }
  return;
}

Assistant:

void update_explode()
{
   EXPLOSION **p = &explosions;
   EXPLOSION *e = explosions;
   EXPLOSION *tmp;

   while (e) {
      e->time += 1.0 / (e->big/2.0 + 1);

      if (e->time > 32) {
	 *p = e->next;
	 tmp = e;
	 e = e->next;
	 free(tmp);
      }
      else {
	 p = &e->next;
	 e = e->next;
      }
   }
}